

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
__thiscall Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::IntegerConstantType>>(PolyNf *this)

{
  undefined8 uVar1;
  PolyNfSuper *pPVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RDX;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *extraout_RDX;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *extraout_RDX_00;
  byte *in_RSI;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  PVar7;
  PolyNf local_48;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_30;
  
  local_48.super_PolyNfSuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  ._0_1_ = *in_RSI & 3;
  if (local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._0_1_ == 2) {
    bVar3 = in_RSI[3];
    bVar4 = in_RSI[4];
    bVar5 = in_RSI[5];
    pPVar2 = &this->super_PolyNfSuper;
    (pPVar2->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    .field_0x0 = in_RSI[2];
    (pPVar2->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0] = bVar3;
    (pPVar2->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[1] = bVar4;
    (pPVar2->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[2] = bVar5;
    *(undefined8 *)
     ((this->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content + 7) = *(undefined8 *)(in_RSI + 10);
  }
  else {
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[4] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[8] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[9] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[10] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xb] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xc] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xd] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xe] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xf] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0x10] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0x11] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0x12] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0x13] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._21_3_ = 0;
    if (local_48.super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._0_1_ == 0) {
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content._0_4_ = *(undefined4 *)(in_RSI + 1);
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content._8_4_ = SUB84(*(undefined8 *)(in_RSI + 9),0);
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content._12_4_ = SUB84((ulong)*(undefined8 *)(in_RSI + 9) >> 0x20,0);
    }
    else if (local_48.super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._0_1_ == 1) {
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content._0_4_ = *(undefined4 *)(in_RSI + 1);
    }
    else {
      uVar1 = *(undefined8 *)(in_RSI + 10);
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content._0_4_ = *(uint *)(in_RSI + 1) & 0xffffff03;
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[4] = (char)((uint)*(undefined4 *)(in_RSI + 2) >> 0x18);
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content._9_3_ = SUB83(uVar1,0);
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content._8_4_ =
           (uint)(uint3)local_48.super_PolyNfSuper._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        .
                        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        ._content._9_3_ << 8;
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content._12_4_ = SUB84((ulong)uVar1 >> 0x18,0);
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0x10] = (char)((ulong)uVar1 >> 0x38);
      local_48.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content._17_3_ = 0;
    }
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[7] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[5] = '\0';
    local_48.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[6] = '\0';
    Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom(&local_30,&local_48);
    PVar7 = Lib::
            perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
                      ((Lib *)this,&local_30);
    in_RDX = PVar7._ptr;
    r = local_30._summands._cursor;
    while (r != local_30._summands._stack) {
      r = r + -1;
      mpz_clear((__mpz_struct *)r);
      in_RDX = extraout_RDX;
    }
    if (r != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
      uVar6 = local_30._summands._capacity << 5;
      if (uVar6 == 0) {
        ((local_30._summands._stack)->numeral)._val[0]._mp_alloc =
             Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        ((local_30._summands._stack)->numeral)._val[0]._mp_size =
             Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_30._summands._stack;
      }
      else if (uVar6 < 0x21) {
        ((local_30._summands._stack)->numeral)._val[0]._mp_alloc =
             Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        ((local_30._summands._stack)->numeral)._val[0]._mp_size =
             Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_30._summands._stack;
      }
      else if (uVar6 < 0x31) {
        ((local_30._summands._stack)->numeral)._val[0]._mp_alloc =
             Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        ((local_30._summands._stack)->numeral)._val[0]._mp_size =
             Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_30._summands._stack;
      }
      else if (uVar6 < 0x41) {
        ((local_30._summands._stack)->numeral)._val[0]._mp_alloc =
             Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        ((local_30._summands._stack)->numeral)._val[0]._mp_size =
             Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_30._summands._stack;
      }
      else {
        operator_delete(local_30._summands._stack,0x10);
        in_RDX = extraout_RDX_00;
      }
    }
  }
  PVar7._ptr = in_RDX;
  PVar7._0_8_ = this;
  return PVar7;
}

Assistant:

Perfect<Polynom<Number>> PolyNf::wrapPoly() const
{
  if (this->is<AnyPoly>()) {
    return this->unwrap<AnyPoly>()
            .unwrap<Perfect<Polynom<Number>>>();
  } else {
    return perfect(Polynom<Number>(*this));
  }
}